

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

void __thiscall
duckdb::TopNHeap::TopNHeap
          (TopNHeap *this,ClientContext *context,Allocator *allocator,
          vector<duckdb::LogicalType,_true> *payload_types_p,
          vector<duckdb::BoundOrderByNode,_true> *orders_p,idx_t limit,idx_t offset)

{
  pointer pBVar1;
  ulong uVar2;
  Allocator *pAVar3;
  BufferManager *pBVar4;
  pointer pEVar5;
  type expr;
  ulong uVar6;
  BoundOrderByNode *order;
  pointer __args;
  initializer_list<duckdb::LogicalType> __l;
  vector<duckdb::LogicalType,_true> sort_types;
  vector<duckdb::LogicalType,_true> sort_keys_type;
  allocator_type local_d1;
  DataChunk *local_d0;
  DataChunk *local_c8;
  DataChunk *local_c0;
  DataChunk *local_b8;
  DataChunk *local_b0;
  DataChunk *local_a8;
  unsafe_vector<TopNEntry> *local_a0;
  Allocator *local_98;
  vector<duckdb::OrderModifiers,std::allocator<duckdb::OrderModifiers>> *local_90;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  StringHeap *local_68;
  LogicalType local_60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  this->allocator = allocator;
  local_98 = allocator;
  pBVar4 = BufferManager::GetBufferManager(context);
  this->buffer_manager = pBVar4;
  local_a0 = &this->heap;
  (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->payload_types = payload_types_p;
  this->orders = orders_p;
  local_90 = (vector<duckdb::OrderModifiers,std::allocator<duckdb::OrderModifiers>> *)
             &this->modifiers;
  (this->modifiers).super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modifiers).super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->modifiers).super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->limit = limit;
  this->offset = offset;
  this->heap_size = offset + limit;
  ExpressionExecutor::ExpressionExecutor(&this->executor,context);
  local_a8 = &this->sort_chunk;
  DataChunk::DataChunk(local_a8);
  local_b0 = &this->heap_data;
  DataChunk::DataChunk(local_b0);
  pAVar3 = local_98;
  local_b8 = &this->payload_chunk;
  DataChunk::DataChunk(local_b8);
  local_c0 = &this->sort_keys;
  DataChunk::DataChunk(local_c0);
  StringHeap::StringHeap(&this->sort_key_heap,pAVar3);
  local_68 = &this->sort_key_heap;
  SelectionVector::SelectionVector(&this->matching_sel,0x800);
  local_c8 = &this->compare_chunk;
  DataChunk::DataChunk(local_c8);
  local_d0 = &this->boundary_values;
  DataChunk::DataChunk(local_d0);
  local_70 = &(this->boundary_val).field_2;
  (this->boundary_val)._M_dataplus._M_p = (pointer)local_70;
  (this->boundary_val)._M_string_length = 0;
  (this->boundary_val).field_2._M_local_buf[0] = '\0';
  SelectionVector::SelectionVector(&this->final_sel,0x800);
  SelectionVector::SelectionVector(&this->true_sel,0x800);
  SelectionVector::SelectionVector(&this->false_sel,0x800);
  SelectionVector::SelectionVector(&this->new_remaining_sel,0x800);
  local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = (this->orders->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (this->orders->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args != pBVar1) {
    do {
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&__args->expression);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_88,&pEVar5->return_type);
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&__args->expression);
      ExpressionExecutor::AddExpression(&this->executor,expr);
      ::std::vector<duckdb::OrderModifiers,std::allocator<duckdb::OrderModifiers>>::
      emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&>
                (local_90,&__args->type,&__args->null_order);
      __args = __args + 1;
    } while (__args != pBVar1);
  }
  uVar2 = this->heap_size * 2;
  uVar6 = 0x2800;
  if (0x2800 < uVar2) {
    uVar6 = uVar2;
  }
  if (0x31fff < uVar6) {
    uVar6 = 0x32000;
  }
  ::std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>::reserve
            (&local_a0->super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>,
             uVar6 + 0x800);
  LogicalType::LogicalType(&local_60,BLOB);
  pAVar3 = local_98;
  __l._M_len = 1;
  __l._M_array = &local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,__l,&local_d1);
  LogicalType::~LogicalType(&local_60);
  DataChunk::Initialize(local_c0,pAVar3,(vector<duckdb::LogicalType,_true> *)&local_48,0x800);
  uVar2 = this->heap_size * 2;
  uVar6 = 0x2800;
  if (0x2800 < uVar2) {
    uVar6 = uVar2;
  }
  if (0x31fff < uVar6) {
    uVar6 = 0x32000;
  }
  DataChunk::Initialize(local_b0,pAVar3,this->payload_types,uVar6 + 0x800);
  DataChunk::Initialize(local_b8,pAVar3,this->payload_types,0x800);
  DataChunk::Initialize(local_a8,pAVar3,(vector<duckdb::LogicalType,_true> *)&local_88,0x800);
  DataChunk::Initialize(local_c8,pAVar3,(vector<duckdb::LogicalType,_true> *)&local_88,0x800);
  DataChunk::Initialize(local_d0,pAVar3,(vector<duckdb::LogicalType,_true> *)&local_88,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_88);
  return;
}

Assistant:

TopNHeap::TopNHeap(ClientContext &context, Allocator &allocator, const vector<LogicalType> &payload_types_p,
                   const vector<BoundOrderByNode> &orders_p, idx_t limit, idx_t offset)
    : allocator(allocator), buffer_manager(BufferManager::GetBufferManager(context)), payload_types(payload_types_p),
      orders(orders_p), limit(limit), offset(offset), heap_size(limit + offset), executor(context),
      sort_key_heap(allocator), matching_sel(STANDARD_VECTOR_SIZE), final_sel(STANDARD_VECTOR_SIZE),
      true_sel(STANDARD_VECTOR_SIZE), false_sel(STANDARD_VECTOR_SIZE), new_remaining_sel(STANDARD_VECTOR_SIZE) {
	// initialize the executor and the sort_chunk
	vector<LogicalType> sort_types;
	for (auto &order : orders) {
		auto &expr = order.expression;
		sort_types.push_back(expr->return_type);
		executor.AddExpression(*expr);
		modifiers.emplace_back(order.type, order.null_order);
	}
	heap.reserve(InitialHeapAllocSize());
	vector<LogicalType> sort_keys_type {LogicalType::BLOB};
	sort_keys.Initialize(allocator, sort_keys_type);
	heap_data.Initialize(allocator, payload_types, InitialHeapAllocSize());
	payload_chunk.Initialize(allocator, payload_types);
	sort_chunk.Initialize(allocator, sort_types);
	compare_chunk.Initialize(allocator, sort_types);
	boundary_values.Initialize(allocator, sort_types);
}